

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-arithm.cpp
# Opt level: O1

int main(void)

{
  uint len;
  uint uVar1;
  
  uVar1 = 0;
  do {
    test_arithm<float>(uVar1,2.0,1.0,false);
    test_abs<float>(uVar1);
    test_arithm<double>(uVar1,2.0,1.0,false);
    test_abs<double>(uVar1);
    uVar1 = uVar1 + 1;
  } while (uVar1 != 0x80);
  uVar1 = 0;
  do {
    test_arithm<int>(uVar1,2,1,false);
    test_arithm<unsigned_int>(uVar1,2,1,false);
    test_abs<int>(uVar1);
    test_abs<unsigned_int>(uVar1);
    test_arithm<long>(uVar1,2,1,false);
    test_arithm<unsigned_long>(uVar1,2,1,false);
    test_abs<long>(uVar1);
    test_abs<unsigned_long>(uVar1);
    uVar1 = uVar1 + 1;
  } while (uVar1 != 0x80);
  uVar1 = 0;
  do {
    test_arithm<unsigned_char>(uVar1,'\x02','\x01',false);
    test_arithm<short>(uVar1,2,1,false);
    test_arithm<unsigned_short>(uVar1,2,1,false);
    test_abs<short>(uVar1);
    test_abs<signed_char>(uVar1);
    uVar1 = uVar1 + 1;
  } while (uVar1 != 0x80);
  return 0;
}

Assistant:

int main()
{
    try
    {
#ifdef ALLOW_TRASH
        bool allowTrash = true;
#else
        bool allowTrash = false;
#endif
#ifdef MORE_DATA
        unsigned start = 1000;
        unsigned end = 1024 * 1024;
        unsigned inc = 100000;
#else
        unsigned start = 0;
        unsigned end = 128;
        unsigned inc = 1;
#endif
        for (unsigned len = start; len < end; len+=inc)
        {
            test_arithm<float>(len, 2, 1, allowTrash);
            test_abs<float>(len);

            test_arithm<double>(len, 2, 1, allowTrash);
            test_abs<double>(len);
        }

        for (unsigned len = start; len < end; len+=inc)
        {
            test_arithm<int32_t>(len, 2, 1, allowTrash);
            test_arithm<uint32_t>(len, 2, 1, allowTrash);
            test_abs<int32_t>(len);
            test_abs<uint32_t>(len);

            test_arithm<int64_t>(len, 2, 1, allowTrash);
            test_arithm<uint64_t>(len, 2, 1, allowTrash);
            test_abs<int64_t>(len);
            test_abs<uint64_t>(len);
        }

#ifndef NO_8_16
        for (unsigned len = start; len < end; len+=inc)
        {
            test_arithm<uint8_t>(len, 2, 1, allowTrash);
            test_arithm<int16_t>(len, 2, 1, allowTrash);
            test_arithm<uint16_t>(len, 2, 1, allowTrash);
            test_abs<int16_t>(len);
            test_abs<int8_t>(len);
        }
#endif
    }
    catch (const simd::Exception& ex) {
        std::cerr << ex.file() << ":" << ex.line() << " (" << ex.code() << ") " << ex.what() << std::endl;
        return 1;
    }
    catch (const Exception& ex)
    {
        std::cerr << "func: " << ex.func_ << " line: " << ex.line_ << " len: " << ex.length_ << std::endl;
        return 1;
    }

    return 0;
}